

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall
Annotator_badAnyCastWithIndices_Test::TestBody(Annotator_badAnyCastWithIndices_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  AssertHelper local_a10 [8];
  Message local_a08 [15];
  allocator<char> local_9f9;
  string local_9f8 [32];
  shared_ptr<libcellml::Variable> local_9d8;
  undefined1 local_9c8 [16];
  AssertionResult gtest_ar_25;
  Message local_9a8 [15];
  allocator<char> local_999;
  string local_998 [32];
  shared_ptr<libcellml::Units> local_978;
  undefined1 local_968 [16];
  AssertionResult gtest_ar_24;
  Message local_948 [15];
  allocator<char> local_939;
  string local_938 [32];
  shared_ptr<libcellml::UnitsItem> local_918;
  undefined1 local_908 [16];
  AssertionResult gtest_ar_23;
  Message local_8e8 [15];
  allocator<char> local_8d9;
  string local_8d8 [32];
  shared_ptr<libcellml::Reset> local_8b8;
  undefined1 local_8a8 [16];
  AssertionResult gtest_ar_22;
  Message local_888 [15];
  allocator<char> local_879;
  string local_878 [32];
  shared_ptr<libcellml::Reset> local_858;
  undefined1 local_848 [16];
  AssertionResult gtest_ar_21;
  Message local_828 [15];
  allocator<char> local_819;
  string local_818 [32];
  shared_ptr<libcellml::Reset> local_7f8;
  undefined1 local_7e8 [16];
  AssertionResult gtest_ar_20;
  Message local_7c8 [15];
  allocator<char> local_7b9;
  string local_7b8 [32];
  shared_ptr<libcellml::VariablePair> local_798;
  undefined1 local_788 [16];
  AssertionResult gtest_ar_19;
  Message local_768 [15];
  allocator<char> local_759;
  string local_758 [32];
  shared_ptr<libcellml::Model> local_738;
  undefined1 local_728 [16];
  AssertionResult gtest_ar_18;
  Message local_708 [15];
  allocator<char> local_6f9;
  string local_6f8 [32];
  shared_ptr<libcellml::ImportSource> local_6d8;
  undefined1 local_6c8 [16];
  AssertionResult gtest_ar_17;
  Message local_6a8 [15];
  allocator<char> local_699;
  string local_698 [32];
  shared_ptr<libcellml::Model> local_678;
  undefined1 local_668 [16];
  AssertionResult gtest_ar_16;
  Message local_648 [15];
  allocator<char> local_639;
  string local_638 [32];
  shared_ptr<libcellml::VariablePair> local_618;
  undefined1 local_608 [16];
  AssertionResult gtest_ar_15;
  Message local_5e8 [15];
  allocator<char> local_5d9;
  string local_5d8 [32];
  shared_ptr<libcellml::Component> local_5b8;
  undefined1 local_5a8 [16];
  AssertionResult gtest_ar_14;
  Message local_588 [15];
  allocator<char> local_579;
  string local_578 [32];
  shared_ptr<libcellml::Component> local_558;
  undefined1 local_548 [16];
  AssertionResult gtest_ar_13;
  Message local_528 [15];
  allocator<char> local_519;
  string local_518 [32];
  shared_ptr<libcellml::Variable> local_4f8;
  undefined1 local_4e8 [16];
  AssertionResult gtest_ar_12;
  Message local_4c8 [15];
  allocator<char> local_4b9;
  string local_4b8 [32];
  shared_ptr<libcellml::Units> local_498;
  undefined1 local_488 [16];
  AssertionResult gtest_ar_11;
  Message local_468 [15];
  allocator<char> local_459;
  string local_458 [32];
  shared_ptr<libcellml::UnitsItem> local_438;
  undefined1 local_428 [16];
  AssertionResult gtest_ar_10;
  Message local_408 [15];
  allocator<char> local_3f9;
  string local_3f8 [32];
  shared_ptr<libcellml::Reset> local_3d8;
  undefined1 local_3c8 [16];
  AssertionResult gtest_ar_9;
  Message local_3a8 [15];
  allocator<char> local_399;
  string local_398 [32];
  shared_ptr<libcellml::Reset> local_378;
  undefined1 local_368 [16];
  AssertionResult gtest_ar_8;
  Message local_348 [15];
  allocator<char> local_339;
  string local_338 [32];
  shared_ptr<libcellml::Reset> local_318;
  undefined1 local_308 [16];
  AssertionResult gtest_ar_7;
  Message local_2e8 [15];
  allocator<char> local_2d9;
  string local_2d8 [32];
  shared_ptr<libcellml::VariablePair> local_2b8;
  undefined1 local_2a8 [16];
  AssertionResult gtest_ar_6;
  Message local_288 [15];
  allocator<char> local_279;
  string local_278 [32];
  shared_ptr<libcellml::Model> local_258;
  undefined1 local_248 [16];
  AssertionResult gtest_ar_5;
  Message local_228 [15];
  allocator<char> local_219;
  string local_218 [32];
  shared_ptr<libcellml::ImportSource> local_1f8;
  undefined1 local_1e8 [16];
  AssertionResult gtest_ar_4;
  Message local_1c8 [15];
  allocator<char> local_1b9;
  string local_1b8 [32];
  shared_ptr<libcellml::Model> local_198;
  undefined1 local_188 [16];
  AssertionResult gtest_ar_3;
  Message local_168 [15];
  allocator<char> local_159;
  string local_158 [32];
  shared_ptr<libcellml::VariablePair> local_138;
  undefined1 local_128 [16];
  AssertionResult gtest_ar_2;
  Message local_108 [15];
  allocator<char> local_f9;
  string local_f8 [32];
  shared_ptr<libcellml::Component> local_d8;
  undefined1 local_c8 [16];
  AssertionResult gtest_ar_1;
  Message local_a8 [15];
  allocator<char> local_99;
  string local_98 [32];
  shared_ptr<libcellml::Component> local_78;
  undefined1 local_68 [16];
  AssertionResult gtest_ar;
  AnnotatorPtr annotator;
  undefined1 local_30 [8];
  ModelPtr m;
  ParserPtr parser;
  Annotator_badAnyCastWithIndices_Test *this_local;
  
  this_00 = &m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  libcellml::Parser::parseModel((string *)local_30);
  libcellml::Annotator::create();
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  libcellml::Annotator::setModel((shared_ptr *)peVar2);
  local_68._0_8_ = (element_type *)0x0;
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_98,"duplicateId",&local_99);
  libcellml::Annotator::component((string *)&local_78,(ulong)peVar2);
  testing::internal::EqHelper<true>::
  Compare<decltype(nullptr),std::shared_ptr<libcellml::Component>>
            (local_68 + 8,"nullptr",(void **)"annotator->component(\"duplicateId\", 0)",
             (shared_ptr<libcellml::Component> *)local_68,&local_78);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_78);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_68 + 8));
  if (!bVar1) {
    testing::Message::Message(local_a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_68 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x7f9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_68 + 8));
  local_c8._0_8_ = (element_type *)0x0;
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"duplicateId",&local_f9);
  libcellml::Annotator::componentEncapsulation((string *)&local_d8,(ulong)peVar2);
  testing::internal::EqHelper<true>::
  Compare<decltype(nullptr),std::shared_ptr<libcellml::Component>>
            (local_c8 + 8,"nullptr",(void **)"annotator->componentEncapsulation(\"duplicateId\", 0)"
             ,(shared_ptr<libcellml::Component> *)local_c8,&local_d8);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_d8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_c8 + 8));
  if (!bVar1) {
    testing::Message::Message(local_108);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_c8 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x7fa,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_c8 + 8));
  local_128._0_8_ = (element_type *)0x0;
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_158,"duplicateId",&local_159);
  libcellml::Annotator::connection((string *)&local_138,(ulong)peVar2);
  testing::internal::EqHelper<true>::
  Compare<decltype(nullptr),std::shared_ptr<libcellml::VariablePair>>
            (local_128 + 8,"nullptr",(void **)"annotator->connection(\"duplicateId\", 0)",
             (shared_ptr<libcellml::VariablePair> *)local_128,&local_138);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr(&local_138);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_128 + 8));
  if (!bVar1) {
    testing::Message::Message(local_168);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_128 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x7fb,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_128 + 8));
  local_188._0_8_ = (element_type *)0x0;
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b8,"duplicateId",&local_1b9);
  libcellml::Annotator::encapsulation((string *)&local_198,(ulong)peVar2);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Model>>
            (local_188 + 8,"nullptr",(void **)"annotator->encapsulation(\"duplicateId\", 1)",
             (shared_ptr<libcellml::Model> *)local_188,&local_198);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_198);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_188 + 8));
  if (!bVar1) {
    testing::Message::Message(local_1c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_188 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x7fc,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_188 + 8));
  local_1e8._0_8_ = (element_type *)0x0;
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_218,"duplicateId",&local_219);
  libcellml::Annotator::importSource((string *)&local_1f8,(ulong)peVar2);
  testing::internal::EqHelper<true>::
  Compare<decltype(nullptr),std::shared_ptr<libcellml::ImportSource>>
            (local_1e8 + 8,"nullptr",(void **)"annotator->importSource(\"duplicateId\", 0)",
             (shared_ptr<libcellml::ImportSource> *)local_1e8,&local_1f8);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr(&local_1f8);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator(&local_219);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_1e8 + 8));
  if (!bVar1) {
    testing::Message::Message(local_228);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_1e8 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x7fd,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_1e8 + 8));
  local_248._0_8_ = (element_type *)0x0;
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_278,"duplicateId",&local_279);
  libcellml::Annotator::model((string *)&local_258,(ulong)peVar2);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Model>>
            (local_248 + 8,"nullptr",(void **)"annotator->model(\"duplicateId\", 1)",
             (shared_ptr<libcellml::Model> *)local_248,&local_258);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_258);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator(&local_279);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_248 + 8));
  if (!bVar1) {
    testing::Message::Message(local_288);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_248 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x7fe,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_248 + 8));
  local_2a8._0_8_ = (element_type *)0x0;
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2d8,"duplicateId",&local_2d9);
  libcellml::Annotator::mapVariables((string *)&local_2b8,(ulong)peVar2);
  testing::internal::EqHelper<true>::
  Compare<decltype(nullptr),std::shared_ptr<libcellml::VariablePair>>
            (local_2a8 + 8,"nullptr",(void **)"annotator->mapVariables(\"duplicateId\", 0)",
             (shared_ptr<libcellml::VariablePair> *)local_2a8,&local_2b8);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr(&local_2b8);
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_2a8 + 8));
  if (!bVar1) {
    testing::Message::Message(local_2e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_2a8 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x7ff,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_2a8 + 8));
  local_308._0_8_ = (element_type *)0x0;
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_338,"duplicateId",&local_339);
  libcellml::Annotator::reset((string *)&local_318,(ulong)peVar2);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Reset>>
            (local_308 + 8,"nullptr",(void **)"annotator->reset(\"duplicateId\", 0)",
             (shared_ptr<libcellml::Reset> *)local_308,&local_318);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_318);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator(&local_339);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_308 + 8));
  if (!bVar1) {
    testing::Message::Message(local_348);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_308 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x800,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_308 + 8));
  local_368._0_8_ = (element_type *)0x0;
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_398,"duplicateId",&local_399);
  libcellml::Annotator::resetValue((string *)&local_378,(ulong)peVar2);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Reset>>
            (local_368 + 8,"nullptr",(void **)"annotator->resetValue(\"duplicateId\", 0)",
             (shared_ptr<libcellml::Reset> *)local_368,&local_378);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_378);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator(&local_399);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_368 + 8));
  if (!bVar1) {
    testing::Message::Message(local_3a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_368 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x801,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,local_3a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(local_3a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_368 + 8));
  local_3c8._0_8_ = (element_type *)0x0;
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3f8,"duplicateId",&local_3f9);
  libcellml::Annotator::testValue((string *)&local_3d8,(ulong)peVar2);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Reset>>
            (local_3c8 + 8,"nullptr",(void **)"annotator->testValue(\"duplicateId\", 0)",
             (shared_ptr<libcellml::Reset> *)local_3c8,&local_3d8);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_3d8);
  std::__cxx11::string::~string(local_3f8);
  std::allocator<char>::~allocator(&local_3f9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_3c8 + 8));
  if (!bVar1) {
    testing::Message::Message(local_408);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_3c8 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x802,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(local_408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_3c8 + 8));
  local_428._0_8_ = (element_type *)0x0;
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_458,"duplicateId",&local_459);
  libcellml::Annotator::unitsItem((string *)&local_438,(ulong)peVar2);
  testing::internal::EqHelper<true>::
  Compare<decltype(nullptr),std::shared_ptr<libcellml::UnitsItem>>
            (local_428 + 8,"nullptr",(void **)"annotator->unitsItem(\"duplicateId\", 0)",
             (shared_ptr<libcellml::UnitsItem> *)local_428,&local_438);
  std::shared_ptr<libcellml::UnitsItem>::~shared_ptr(&local_438);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator(&local_459);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_428 + 8));
  if (!bVar1) {
    testing::Message::Message(local_468);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_428 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x803,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,local_468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(local_468);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_428 + 8));
  local_488._0_8_ = (element_type *)0x0;
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4b8,"duplicateId",&local_4b9);
  libcellml::Annotator::units((string *)&local_498,(ulong)peVar2);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Units>>
            (local_488 + 8,"nullptr",(void **)"annotator->units(\"duplicateId\", 0)",
             (shared_ptr<libcellml::Units> *)local_488,&local_498);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_498);
  std::__cxx11::string::~string(local_4b8);
  std::allocator<char>::~allocator(&local_4b9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_488 + 8));
  if (!bVar1) {
    testing::Message::Message(local_4c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_488 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x804,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,local_4c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(local_4c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_488 + 8));
  local_4e8._0_8_ = (element_type *)0x0;
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_518,"duplicateId",&local_519);
  libcellml::Annotator::variable((string *)&local_4f8,(ulong)peVar2);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Variable>>
            (local_4e8 + 8,"nullptr",(void **)"annotator->variable(\"duplicateId\", 0)",
             (shared_ptr<libcellml::Variable> *)local_4e8,&local_4f8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_4f8);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator(&local_519);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_4e8 + 8));
  if (!bVar1) {
    testing::Message::Message(local_528);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_4e8 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x805,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,local_528);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(local_528);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_4e8 + 8));
  local_548._0_8_ = (element_type *)0x0;
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_578,"duplicateId",&local_579);
  libcellml::Annotator::component((string *)&local_558,(ulong)peVar2);
  testing::internal::EqHelper<true>::
  Compare<decltype(nullptr),std::shared_ptr<libcellml::Component>>
            (local_548 + 8,"nullptr",(void **)"annotator->component(\"duplicateId\", 99)",
             (shared_ptr<libcellml::Component> *)local_548,&local_558);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_558);
  std::__cxx11::string::~string(local_578);
  std::allocator<char>::~allocator(&local_579);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_548 + 8));
  if (!bVar1) {
    testing::Message::Message(local_588);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_548 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x807,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,local_588);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(local_588);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_548 + 8));
  local_5a8._0_8_ = (element_type *)0x0;
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5d8,"duplicateId",&local_5d9);
  libcellml::Annotator::componentEncapsulation((string *)&local_5b8,(ulong)peVar2);
  testing::internal::EqHelper<true>::
  Compare<decltype(nullptr),std::shared_ptr<libcellml::Component>>
            (local_5a8 + 8,"nullptr",
             (void **)"annotator->componentEncapsulation(\"duplicateId\", 99)",
             (shared_ptr<libcellml::Component> *)local_5a8,&local_5b8);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_5b8);
  std::__cxx11::string::~string(local_5d8);
  std::allocator<char>::~allocator(&local_5d9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_5a8 + 8));
  if (!bVar1) {
    testing::Message::Message(local_5e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_5a8 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x808,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,local_5e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(local_5e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_5a8 + 8));
  local_608._0_8_ = (element_type *)0x0;
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_638,"duplicateId",&local_639);
  libcellml::Annotator::connection((string *)&local_618,(ulong)peVar2);
  testing::internal::EqHelper<true>::
  Compare<decltype(nullptr),std::shared_ptr<libcellml::VariablePair>>
            (local_608 + 8,"nullptr",(void **)"annotator->connection(\"duplicateId\", 99)",
             (shared_ptr<libcellml::VariablePair> *)local_608,&local_618);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr(&local_618);
  std::__cxx11::string::~string(local_638);
  std::allocator<char>::~allocator(&local_639);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_608 + 8));
  if (!bVar1) {
    testing::Message::Message(local_648);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_608 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x809,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,local_648);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(local_648);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_608 + 8));
  local_668._0_8_ = (element_type *)0x0;
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_698,"duplicateId",&local_699);
  libcellml::Annotator::encapsulation((string *)&local_678,(ulong)peVar2);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Model>>
            (local_668 + 8,"nullptr",(void **)"annotator->encapsulation(\"duplicateId\", 99)",
             (shared_ptr<libcellml::Model> *)local_668,&local_678);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_678);
  std::__cxx11::string::~string(local_698);
  std::allocator<char>::~allocator(&local_699);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_668 + 8));
  if (!bVar1) {
    testing::Message::Message(local_6a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_668 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x80a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,local_6a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(local_6a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_668 + 8));
  local_6c8._0_8_ = (element_type *)0x0;
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6f8,"duplicateId",&local_6f9);
  libcellml::Annotator::importSource((string *)&local_6d8,(ulong)peVar2);
  testing::internal::EqHelper<true>::
  Compare<decltype(nullptr),std::shared_ptr<libcellml::ImportSource>>
            (local_6c8 + 8,"nullptr",(void **)"annotator->importSource(\"duplicateId\", 99)",
             (shared_ptr<libcellml::ImportSource> *)local_6c8,&local_6d8);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr(&local_6d8);
  std::__cxx11::string::~string(local_6f8);
  std::allocator<char>::~allocator(&local_6f9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_6c8 + 8));
  if (!bVar1) {
    testing::Message::Message(local_708);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_6c8 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x80b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,local_708);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(local_708);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_6c8 + 8));
  local_728._0_8_ = (element_type *)0x0;
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_758,"duplicateId",&local_759);
  libcellml::Annotator::model((string *)&local_738,(ulong)peVar2);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Model>>
            (local_728 + 8,"nullptr",(void **)"annotator->model(\"duplicateId\", 99)",
             (shared_ptr<libcellml::Model> *)local_728,&local_738);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_738);
  std::__cxx11::string::~string(local_758);
  std::allocator<char>::~allocator(&local_759);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_728 + 8));
  if (!bVar1) {
    testing::Message::Message(local_768);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_728 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x80c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,local_768);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(local_768);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_728 + 8));
  local_788._0_8_ = (element_type *)0x0;
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7b8,"duplicateId",&local_7b9);
  libcellml::Annotator::mapVariables((string *)&local_798,(ulong)peVar2);
  testing::internal::EqHelper<true>::
  Compare<decltype(nullptr),std::shared_ptr<libcellml::VariablePair>>
            (local_788 + 8,"nullptr",(void **)"annotator->mapVariables(\"duplicateId\", 99)",
             (shared_ptr<libcellml::VariablePair> *)local_788,&local_798);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr(&local_798);
  std::__cxx11::string::~string(local_7b8);
  std::allocator<char>::~allocator(&local_7b9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_788 + 8));
  if (!bVar1) {
    testing::Message::Message(local_7c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_788 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x80d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,local_7c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(local_7c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_788 + 8));
  local_7e8._0_8_ = (element_type *)0x0;
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_818,"duplicateId",&local_819);
  libcellml::Annotator::reset((string *)&local_7f8,(ulong)peVar2);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Reset>>
            (local_7e8 + 8,"nullptr",(void **)"annotator->reset(\"duplicateId\", 99)",
             (shared_ptr<libcellml::Reset> *)local_7e8,&local_7f8);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_7f8);
  std::__cxx11::string::~string(local_818);
  std::allocator<char>::~allocator(&local_819);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_7e8 + 8));
  if (!bVar1) {
    testing::Message::Message(local_828);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_7e8 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x80e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,local_828);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(local_828);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_7e8 + 8));
  local_848._0_8_ = (element_type *)0x0;
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_878,"duplicateId",&local_879);
  libcellml::Annotator::resetValue((string *)&local_858,(ulong)peVar2);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Reset>>
            (local_848 + 8,"nullptr",(void **)"annotator->resetValue(\"duplicateId\", 99)",
             (shared_ptr<libcellml::Reset> *)local_848,&local_858);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_858);
  std::__cxx11::string::~string(local_878);
  std::allocator<char>::~allocator(&local_879);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_848 + 8));
  if (!bVar1) {
    testing::Message::Message(local_888);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_848 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x80f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,local_888);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(local_888);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_848 + 8));
  local_8a8._0_8_ = (element_type *)0x0;
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8d8,"duplicateId",&local_8d9);
  libcellml::Annotator::testValue((string *)&local_8b8,(ulong)peVar2);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Reset>>
            (local_8a8 + 8,"nullptr",(void **)"annotator->testValue(\"duplicateId\", 99)",
             (shared_ptr<libcellml::Reset> *)local_8a8,&local_8b8);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_8b8);
  std::__cxx11::string::~string(local_8d8);
  std::allocator<char>::~allocator(&local_8d9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_8a8 + 8));
  if (!bVar1) {
    testing::Message::Message(local_8e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_8a8 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x810,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,local_8e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(local_8e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_8a8 + 8));
  local_908._0_8_ = (element_type *)0x0;
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_938,"duplicateId",&local_939);
  libcellml::Annotator::unitsItem((string *)&local_918,(ulong)peVar2);
  testing::internal::EqHelper<true>::
  Compare<decltype(nullptr),std::shared_ptr<libcellml::UnitsItem>>
            (local_908 + 8,"nullptr",(void **)"annotator->unitsItem(\"duplicateId\", 99)",
             (shared_ptr<libcellml::UnitsItem> *)local_908,&local_918);
  std::shared_ptr<libcellml::UnitsItem>::~shared_ptr(&local_918);
  std::__cxx11::string::~string(local_938);
  std::allocator<char>::~allocator(&local_939);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_908 + 8));
  if (!bVar1) {
    testing::Message::Message(local_948);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_908 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x811,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,local_948);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(local_948);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_908 + 8));
  local_968._0_8_ = (element_type *)0x0;
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_998,"duplicateId",&local_999);
  libcellml::Annotator::units((string *)&local_978,(ulong)peVar2);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Units>>
            (local_968 + 8,"nullptr",(void **)"annotator->units(\"duplicateId\", 99)",
             (shared_ptr<libcellml::Units> *)local_968,&local_978);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_978);
  std::__cxx11::string::~string(local_998);
  std::allocator<char>::~allocator(&local_999);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_968 + 8));
  if (!bVar1) {
    testing::Message::Message(local_9a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_968 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x812,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,local_9a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(local_9a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_968 + 8));
  local_9c8._0_8_ = (element_type *)0x0;
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_9f8,"duplicateId",&local_9f9);
  libcellml::Annotator::variable((string *)&local_9d8,(ulong)peVar2);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Variable>>
            (local_9c8 + 8,"nullptr",(void **)"annotator->variable(\"duplicateId\", 99)",
             (shared_ptr<libcellml::Variable> *)local_9c8,&local_9d8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_9d8);
  std::__cxx11::string::~string(local_9f8);
  std::allocator<char>::~allocator(&local_9f9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_9c8 + 8));
  if (!bVar1) {
    testing::Message::Message(local_a08);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_9c8 + 8));
    testing::internal::AssertHelper::AssertHelper
              (local_a10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x813,pcVar3);
    testing::internal::AssertHelper::operator=(local_a10,local_a08);
    testing::internal::AssertHelper::~AssertHelper(local_a10);
    testing::Message::~Message(local_a08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_9c8 + 8));
  std::shared_ptr<libcellml::Annotator>::~shared_ptr
            ((shared_ptr<libcellml::Annotator> *)&gtest_ar.message_);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_30);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Annotator, badAnyCastWithIndices)
{
    auto parser = libcellml::Parser::create();
    auto m = parser->parseModel(modelStringDuplicateIds);
    auto annotator = libcellml::Annotator::create();
    annotator->setModel(m);

    // Trigger errors on all items because of miscasting:
    EXPECT_EQ(nullptr, annotator->component("duplicateId", 0));
    EXPECT_EQ(nullptr, annotator->componentEncapsulation("duplicateId", 0));
    EXPECT_EQ(nullptr, annotator->connection("duplicateId", 0));
    EXPECT_EQ(nullptr, annotator->encapsulation("duplicateId", 1));
    EXPECT_EQ(nullptr, annotator->importSource("duplicateId", 0));
    EXPECT_EQ(nullptr, annotator->model("duplicateId", 1));
    EXPECT_EQ(nullptr, annotator->mapVariables("duplicateId", 0));
    EXPECT_EQ(nullptr, annotator->reset("duplicateId", 0));
    EXPECT_EQ(nullptr, annotator->resetValue("duplicateId", 0));
    EXPECT_EQ(nullptr, annotator->testValue("duplicateId", 0));
    EXPECT_EQ(nullptr, annotator->unitsItem("duplicateId", 0));
    EXPECT_EQ(nullptr, annotator->units("duplicateId", 0));
    EXPECT_EQ(nullptr, annotator->variable("duplicateId", 0));

    EXPECT_EQ(nullptr, annotator->component("duplicateId", 99));
    EXPECT_EQ(nullptr, annotator->componentEncapsulation("duplicateId", 99));
    EXPECT_EQ(nullptr, annotator->connection("duplicateId", 99));
    EXPECT_EQ(nullptr, annotator->encapsulation("duplicateId", 99));
    EXPECT_EQ(nullptr, annotator->importSource("duplicateId", 99));
    EXPECT_EQ(nullptr, annotator->model("duplicateId", 99));
    EXPECT_EQ(nullptr, annotator->mapVariables("duplicateId", 99));
    EXPECT_EQ(nullptr, annotator->reset("duplicateId", 99));
    EXPECT_EQ(nullptr, annotator->resetValue("duplicateId", 99));
    EXPECT_EQ(nullptr, annotator->testValue("duplicateId", 99));
    EXPECT_EQ(nullptr, annotator->unitsItem("duplicateId", 99));
    EXPECT_EQ(nullptr, annotator->units("duplicateId", 99));
    EXPECT_EQ(nullptr, annotator->variable("duplicateId", 99));
}